

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_tar_pax_large_attr.c
# Opt level: O3

void test_read_format_tar_pax_large_attr(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a;
  char *pcVar4;
  time_t v2;
  la_int64_t lVar5;
  archive_entry *ae;
  char name [42];
  archive_entry *local_70;
  char local_68 [56];
  
  builtin_strncpy(local_68 + 0x20,"ttr.tar.Z",10);
  builtin_strncpy(local_68 + 0x10,"_tar_pax_large_a",0x10);
  builtin_strncpy(local_68,"test_read_format",0x10);
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar_pax_large_attr.c"
                   ,L'&',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar_pax_large_attr.c"
                      ,L'\'',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar_pax_large_attr.c"
                      ,L'(',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  extract_reference_file(local_68);
  wVar2 = archive_read_open_filename(a,local_68,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar_pax_large_attr.c"
                      ,L'*',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 10240)",
                      a);
  iVar1 = archive_read_next_header((archive *)a,&local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar_pax_large_attr.c"
                      ,L'-',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_70);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar_pax_large_attr.c"
             ,L'.',"foo","\"foo\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  v2 = archive_entry_mtime(local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar_pax_large_attr.c"
                      ,L'/',1,"1",v2,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_uid(local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar_pax_large_attr.c"
                      ,L'0',1000,"1000",lVar5,"archive_entry_uid(ae)",(void *)0x0);
  pcVar4 = archive_entry_uname(local_70);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar_pax_large_attr.c"
             ,L'1',"tim","\"tim\"",pcVar4,"archive_entry_uname(ae)",(void *)0x0,L'\0');
  lVar5 = archive_entry_gid(local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar_pax_large_attr.c"
                      ,L'2',0,"0",lVar5,"archive_entry_gid(ae)",(void *)0x0);
  pcVar4 = archive_entry_gname(local_70);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar_pax_large_attr.c"
             ,L'3',"wheel","\"wheel\"",pcVar4,"archive_entry_gname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_mode(local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar_pax_large_attr.c"
                      ,L'4',0x81a4,"0100644",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar_pax_large_attr.c"
                      ,L'5',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar_pax_large_attr.c"
                      ,L'6',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
  iVar1 = archive_read_next_header((archive *)a,&local_70);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar_pax_large_attr.c"
                      ,L'9',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  iVar1 = archive_filter_code((archive *)a,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar_pax_large_attr.c"
                      ,L'<',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS",
                      (void *)0x0);
  iVar1 = archive_format((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar_pax_large_attr.c"
                      ,L'=',(long)iVar1,"archive_format(a)",0x30002,
                      "ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE",(void *)0x0);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar_pax_large_attr.c"
                      ,L'?',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar_pax_large_attr.c"
                      ,L'@',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_tar_pax_large_attr)
{
	char name[] = "test_read_format_tar_pax_large_attr.tar.Z";
	struct archive_entry *ae;
	struct archive *a;

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name, 10240));

	/* Read first entry. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("foo", archive_entry_pathname(ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(1000, archive_entry_uid(ae));
	assertEqualString("tim", archive_entry_uname(ae));
	assertEqualInt(0, archive_entry_gid(ae));
	assertEqualString("wheel", archive_entry_gname(ae));
	assertEqualInt(0100644, archive_entry_mode(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Verify the end-of-archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify that the format detection worked. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE);

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}